

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int archive_read_format_7zip_read_data_skip(archive_read *a)

{
  long *plVar1;
  void *pvVar2;
  size_t sVar3;
  void *pvVar4;
  ssize_t sVar5;
  size_t size;
  void *local_38;
  
  pvVar2 = a->format->data;
  if (*(long *)((long)pvVar2 + 0x120) != 0) {
    read_consume(a);
  }
  if (*(char *)((long)pvVar2 + 0xd0) != '\0') {
    return 0;
  }
  sVar3 = *(size_t *)((long)pvVar2 + 0xc0);
  pvVar4 = a->format->data;
  if (*(int *)((long)pvVar4 + 0x100) == 0) {
    plVar1 = (long *)(*(long *)((long)pvVar4 + 0x38) + 0x60 +
                     (ulong)*(uint *)(*(long *)((long)pvVar4 + 0xa8) + 0x10) * 0x68);
    *plVar1 = *plVar1 + sVar3;
  }
  else {
    size = sVar3;
    if (sVar3 == 0) goto LAB_0040fe97;
    do {
      sVar5 = read_stream(a,&local_38,size,0);
      if (sVar5 < 0) {
        return -0x1e;
      }
      if (sVar5 == 0) {
        archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
        return -0x1e;
      }
      if (*(long *)((long)pvVar4 + 0x120) != 0) {
        read_consume(a);
      }
      size = size - sVar5;
    } while (size != 0);
  }
  if ((long)sVar3 < 0) {
    return -0x1e;
  }
LAB_0040fe97:
  *(undefined8 *)((long)pvVar2 + 0xc0) = 0;
  *(undefined1 *)((long)pvVar2 + 0xd0) = 1;
  return 0;
}

Assistant:

static int
archive_read_format_7zip_read_data_skip(struct archive_read *a)
{
	struct _7zip *zip;
	int64_t bytes_skipped;

	zip = (struct _7zip *)(a->format->data);

	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/*
	 * If the length is at the beginning, we can skip the
	 * compressed data much more quickly.
	 */
	bytes_skipped = skip_stream(a, (size_t)zip->entry_bytes_remaining);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);
	zip->entry_bytes_remaining = 0;

	/* This entry is finished and done. */
	zip->end_of_entry = 1;
	return (ARCHIVE_OK);
}